

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int skip_whitespace(istream *is)

{
  int iVar1;
  int iVar2;
  
  while( true ) {
    while( true ) {
      iVar1 = std::istream::peek();
      if (iVar1 == -1) {
        return -1;
      }
      iVar2 = isspace(iVar1);
      if (iVar2 == 0) break;
      std::istream::get();
    }
    if (iVar1 != 0x3b) break;
    iVar1 = 0x3b;
    while ((iVar1 != -1 && (iVar1 != 10))) {
      iVar1 = std::istream::get();
    }
  }
  return iVar1;
}

Assistant:

static int skip_whitespace(std::istream &is)
{
    int c;
    while(true)
    {
        c = is.peek();
        while(c != EOF && isspace(c))
        {
            is.get();
            c = is.peek();
        }
        if(c == ';')
        {
            while(c != EOF && c != '\n')
            {
                c = is.get();
            }
        }
        else
            return c;
    }
}